

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

int __thiscall crnlib::dynamic_string::find_right(dynamic_string *this,char *p,bool case_sensitive)

{
  int iVar1;
  size_t sVar2;
  undefined7 in_register_00000011;
  uint uVar3;
  uint uVar4;
  code *pcVar5;
  
  sVar2 = strlen(p);
  if ((int)CONCAT71(in_register_00000011,case_sensitive) == 0) {
    pcVar5 = strncasecmp;
  }
  else {
    pcVar5 = strncmp;
  }
  uVar4 = (uint)this->m_len - (int)sVar2;
  while ((uVar3 = 0xffffffff, -1 < (int)uVar4 &&
         (iVar1 = (*pcVar5)(p,this->m_pStr + uVar4,(long)(int)sVar2), uVar3 = uVar4, iVar1 != 0))) {
    uVar4 = uVar4 - 1;
  }
  return uVar3;
}

Assistant:

int dynamic_string::find_right(const char* p, bool case_sensitive) const {
  CRNLIB_ASSERT(p);
  const int p_len = (int)strlen(p);

  for (int i = m_len - p_len; i >= 0; i--)
    if ((case_sensitive ? strncmp : crnlib_strnicmp)(p, &m_pStr[i], p_len) == 0)
      return i;

  return -1;
}